

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svsetbase.h
# Opt level: O2

int __thiscall soplex::SVSetBase<double>::remove(SVSetBase<double> *this,char *__filename)

{
  int iVar1;
  ulong uVar2;
  
  for (uVar2 = (ulong)(uint)(this->set).thenum; 0 < (int)uVar2; uVar2 = uVar2 - 1) {
    if (*(int *)(__filename + uVar2 * 4 + -4) < 0) {
      deleteVec(this,&(this->set).theitem[(this->set).thekey[uVar2 - 1].idx].data);
    }
  }
  iVar1 = ClassSet<soplex::SVSetBase<double>::DLPSV>::remove(&this->set,__filename);
  return iVar1;
}

Assistant:

void remove(int perm[])
   {
      int j = num();

      /* due to performance reasons we use a backwards loop to delete entries, because it could result instead of only
       * decreasing the number of elements j times in memmoving the whole array j times
       */
      for(int i = j - 1; i >= 0; --i)
      {
         if(perm[i] < 0)
         {
            deleteVec(&set[i]);
         }
      }

      set.remove(perm);
   }